

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

double __thiscall
imrt::EvaluationFunction::eval
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  int iVar1;
  int k;
  long lVar2;
  int o;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  std::
  _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::clear(&(this->voxels)._M_t);
  generate_Z(this,p);
  this->F = 0.0;
  dVar4 = 0.0;
  for (lVar3 = 0; lVar3 < this->nb_organs; lVar3 = lVar3 + 1) {
    dVar4 = 0.0;
    for (lVar2 = 0;
        iVar1 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3], lVar2 < iVar1; lVar2 = lVar2 + 1) {
      dVar6 = *(double *)
               (*(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar3].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar2 * 8);
      dVar5 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if (dVar6 < dVar5) {
        dVar5 = dVar5 - dVar6;
        dVar4 = dVar4 + dVar5 * dVar5 *
                        (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar3];
      }
      dVar5 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      if (dVar5 < dVar6) {
        dVar6 = dVar6 - dVar5;
        dVar4 = dVar4 + dVar6 * dVar6 *
                        (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar3];
      }
      update_sorted_voxels(this,w,Zmin,Zmax,(int)lVar3,(int)lVar2);
      update_beamlets_impact(this,(int)lVar3,(int)lVar2,0.0);
    }
    dVar4 = dVar4 / (double)iVar1 + this->F;
    this->F = dVar4;
  }
  n_evaluations = n_evaluations + 1;
  return dVar4;
}

Assistant:

double EvaluationFunction::eval(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	voxels.clear();
	generate_Z(p);
	F=0.0;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(Z[o][k] < Zmin[o] )
				 pen += w[o] * ( pow(Zmin[o]-Z[o][k], 2) );

			if(Z[o][k] > Zmax[o] )
				 pen += w[o] * ( pow(Z[o][k]-Zmax[o], 2) );

			update_sorted_voxels(w, Zmin, Zmax, o, k);
			update_beamlets_impact(o, k);
		}
		F+=pen/nb_voxels[o];
	}

	//for(auto b:beamlet_impact)
		//cout << b.first.first << "," << b.first.second << ":" << b.second << " " << endl;

	n_evaluations++;
	return F;
}